

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int backtrack_loop(saucy *s)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  saucy_stats *psVar7;
  bool bVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  int iVar12;
  int *start_1;
  int start;
  int iVar13;
  long lVar14;
  int *piVar15;
  int *piVar16;
  int iVar17;
  int iVar18;
  int *piVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  double dVar23;
  
  do {
    iVar12 = s->lev + -1;
    s->lev = iVar12;
    if (iVar12 == 0) {
      return -1;
    }
    rewind_coloring(s,&s->right,iVar12);
    iVar12 = s->lev;
    lVar14 = (long)iVar12;
    s->nsplits = s->splitlev[lVar14];
    lVar11 = (long)s->ndiffs;
    iVar13 = s->difflev[lVar14];
    if (iVar13 < s->ndiffs) {
      do {
        lVar14 = lVar11 + -1;
        lVar11 = lVar11 + -1;
        s->diffmark[s->diffs[lVar14]] = '\0';
        iVar12 = s->lev;
        lVar14 = (long)iVar12;
        iVar13 = s->difflev[lVar14];
      } while (iVar13 < lVar11);
    }
    s->ndiffs = iVar13;
    s->nundiffs = s->undifflev[lVar14];
    if (iVar12 < s->anc) {
      piVar10 = s->start;
      lVar11 = (long)piVar10[lVar14];
      piVar15 = (s->left).lab;
      iVar13 = (s->right).clen[lVar11];
      s->anc = iVar12;
      s->indmin = piVar15[iVar13 + lVar11];
      s->match = 1;
      piVar15 = s->splitlev;
      lVar11 = (long)piVar15[lVar14 + 1];
      if (piVar15[lVar14] < piVar15[lVar14 + 1]) {
        piVar16 = s->splitfrom;
        piVar19 = s->threp;
        piVar3 = s->splitwho;
        piVar4 = s->thnext;
        piVar5 = s->thprev;
        do {
          iVar12 = piVar16[lVar11 + -1];
          uVar1 = piVar19[iVar12];
          uVar2 = piVar19[piVar3[lVar11 + -1]];
          uVar22 = (ulong)(int)uVar2;
          piVar4[piVar5[(int)uVar1]] = uVar2;
          piVar4[piVar5[uVar22]] = uVar1;
          iVar13 = piVar5[(int)uVar1];
          piVar5[(int)uVar1] = piVar5[uVar22];
          piVar5[uVar22] = iVar13;
          if (uVar2 != uVar1) {
            piVar6 = s->thfront;
            do {
              iVar13 = (int)uVar22;
              piVar6[iVar13] = iVar12;
              uVar22 = (ulong)(uint)piVar4[iVar13];
            } while (piVar4[iVar13] != uVar1);
          }
          lVar11 = lVar11 + -1;
        } while (piVar15[s->anc] < lVar11);
      }
      s->kanctar = 0;
      piVar15 = s->anctar;
      iVar12 = s->threp[piVar10[s->lev]];
      s->kanctar = 1;
      *piVar15 = iVar12;
      piVar10 = s->thnext;
      for (iVar13 = piVar10[iVar12]; iVar13 != iVar12; iVar13 = piVar10[iVar13]) {
        iVar17 = s->kanctar;
        s->kanctar = iVar17 + 1;
        piVar15[iVar17] = iVar13;
      }
      piVar10 = s->thsize;
      iVar12 = s->kanctar;
      iVar13 = 1;
      do {
        iVar13 = iVar13 * 3 + 1;
      } while (iVar13 < iVar12 / 3);
      do {
        lVar11 = (long)iVar13;
        if (iVar13 < iVar12) {
          iVar17 = 0;
          do {
            iVar18 = piVar15[lVar11];
            iVar9 = iVar17;
            do {
              iVar20 = iVar13 + iVar9;
              if (piVar10[piVar15[iVar9]] <= piVar10[iVar18]) goto LAB_002a78af;
              piVar15[iVar20] = piVar15[iVar9];
              iVar20 = iVar9 - iVar13;
              bVar8 = iVar13 <= iVar9;
              iVar9 = iVar20;
            } while (bVar8);
            iVar20 = iVar20 + iVar13;
LAB_002a78af:
            piVar15[iVar20] = iVar18;
            lVar11 = lVar11 + 1;
            iVar17 = iVar17 + 1;
          } while (lVar11 != iVar12);
        }
        bVar8 = 2 < iVar13;
        iVar13 = iVar13 / 3;
      } while (bVar8);
    }
    iVar12 = s->lev;
    if (iVar12 == s->anc) {
      iVar12 = s->indmin;
      piVar10 = s->theta;
      iVar13 = iVar12;
      do {
        iVar17 = iVar13;
        iVar13 = piVar10[iVar17];
      } while (iVar17 != piVar10[iVar17]);
      iVar13 = piVar10[iVar12];
      if (iVar13 != iVar17) {
        piVar15 = piVar10 + iVar12;
        do {
          *piVar15 = iVar17;
          piVar15 = piVar10 + iVar13;
          iVar13 = *piVar15;
        } while (iVar13 != iVar17);
      }
      iVar12 = s->thsize[iVar17];
      if (0 < s->npairs) {
        piVar15 = s->pairs;
        piVar16 = s->unpairs;
        lVar11 = 0;
        do {
          piVar16[piVar15[lVar11]] = -1;
          lVar11 = lVar11 + 1;
        } while (lVar11 < s->npairs);
      }
      s->npairs = 0;
      if (0 < s->ndiffnons) {
        piVar15 = s->diffnons;
        piVar16 = s->undiffnons;
        lVar11 = 0;
        do {
          piVar16[piVar15[lVar11]] = -1;
          lVar11 = lVar11 + 1;
        } while (lVar11 < s->ndiffnons);
      }
      s->ndiffnons = 0;
      s->npairs = 0;
      s->nundiffs = 0;
      s->ndiffs = 0;
      iVar13 = s->start[s->lev];
      iVar9 = -1;
      if (iVar12 != (s->right).clen[iVar13] + 1) {
        iVar17 = s->indmin;
        iVar18 = iVar17;
        do {
          iVar20 = iVar18;
          iVar18 = piVar10[iVar20];
        } while (iVar20 != piVar10[iVar20]);
        iVar18 = piVar10[iVar17];
        if (iVar18 != iVar20) {
          piVar15 = piVar10 + iVar17;
          do {
            *piVar15 = iVar20;
            piVar15 = piVar10 + iVar18;
            iVar18 = *piVar15;
          } while (iVar18 != iVar20);
        }
        do {
          iVar17 = s->kanctar;
          if ((long)iVar17 == 0) goto LAB_002a7a87;
          s->kanctar = iVar17 + -1;
          iVar17 = s->anctar[(long)iVar17 + -1];
          iVar18 = iVar17;
          do {
            iVar21 = iVar18;
            iVar18 = piVar10[iVar21];
          } while (iVar21 != piVar10[iVar21]);
          iVar18 = piVar10[iVar17];
          if (iVar18 != iVar21) {
            piVar15 = piVar10 + iVar17;
            do {
              *piVar15 = iVar21;
              piVar15 = piVar10 + iVar18;
              iVar18 = *piVar15;
            } while (iVar18 != iVar21);
          }
        } while ((iVar21 != iVar17) || (iVar21 == iVar20));
        iVar9 = (s->right).unlab[iVar17] - iVar13;
      }
LAB_002a7a87:
      if (iVar9 == -1) {
        psVar7 = s->stats;
        dVar23 = (double)iVar12 * psVar7->grpsize_base;
        psVar7->grpsize_base = dVar23;
        if (10000000000.0 < dVar23) {
          psVar7->grpsize_base = dVar23 / 10000000000.0;
          psVar7->grpsize_exp = psVar7->grpsize_exp + 10;
        }
      }
    }
    else {
      piVar10 = (s->right).clen;
      iVar13 = s->start[iVar12];
      lVar11 = (long)iVar13;
      iVar17 = piVar10[lVar11];
      iVar12 = s->specmin[iVar12];
      if (0 < s->npairs) {
        piVar15 = s->pairs;
        piVar16 = s->unpairs;
        lVar14 = 0;
        do {
          piVar16[piVar15[lVar14]] = -1;
          lVar14 = lVar14 + 1;
        } while (lVar14 < s->npairs);
      }
      s->npairs = 0;
      if (0 < s->ndiffnons) {
        piVar15 = s->diffnons;
        piVar16 = s->undiffnons;
        lVar14 = 0;
        do {
          piVar16[piVar15[lVar14]] = -1;
          lVar14 = lVar14 + 1;
        } while (lVar14 < s->ndiffnons);
      }
      lVar14 = iVar17 + lVar11;
      s->ndiffnons = -1;
      s->npairs = -1;
      piVar15 = (s->right).lab;
      iVar18 = piVar15[lVar14];
      if (iVar18 == iVar12) {
        piVar15 = piVar15 + lVar11;
        iVar12 = piVar10[lVar11];
        piVar10 = piVar15;
        if (iVar12 != 0) {
          lVar11 = (long)(iVar12 + 1) * 4 + -4;
          piVar19 = piVar15;
          piVar16 = piVar15;
          do {
            piVar16 = piVar16 + 1;
            piVar10 = piVar16;
            if (*piVar19 <= *piVar16) {
              piVar10 = piVar19;
            }
            lVar11 = lVar11 + -4;
            piVar19 = piVar10;
          } while (lVar11 != 0);
        }
        iVar9 = (int)((ulong)((long)piVar10 - (long)piVar15) >> 2);
        if (iVar17 == iVar9) {
LAB_002a7bf8:
          iVar9 = orbit_prune(s);
        }
      }
      else {
        iVar9 = orbit_prune(s);
        if (iVar9 == -1) {
          iVar9 = -1;
        }
        else {
          iVar13 = iVar13 + iVar9;
          iVar17 = piVar15[iVar13];
          if (iVar17 == iVar12) {
            piVar15[iVar13] = iVar18;
            piVar10 = (s->right).unlab;
            piVar10[iVar18] = iVar13;
            piVar15[lVar14] = iVar17;
            piVar10[iVar17] = (int)lVar14;
            goto LAB_002a7bf8;
          }
        }
      }
    }
    if (iVar9 != -1) {
      return iVar9 + s->start[s->lev];
    }
  } while( true );
}

Assistant:

static int
backtrack_loop(struct saucy *s)
{
    int min;

    /* Backtrack as long as we're exhausting target cells */
    for (--s->lev; s->lev; --s->lev) {
        min = do_backtrack(s);
        if (min != -1) return min + s->start[s->lev];
    }
    return -1;
}